

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O0

UnitInputType Kernel::getInputType(UnitList *units)

{
  bool bVar1;
  List<Kernel::Unit_*> *in_RDI;
  UnitInputType res;
  Iterator uit;
  UnitInputType local_11;
  Iterator in_stack_fffffffffffffff0;
  
  Lib::List<Kernel::Unit_*>::Iterator::Iterator((Iterator *)&stack0xfffffffffffffff0,in_RDI);
  Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0x85e272);
  Lib::List<Kernel::Unit_*>::Iterator::next((Iterator *)in_stack_fffffffffffffff0._lst);
  local_11 = Unit::inputType((Unit *)0x85e288);
  while( true ) {
    bVar1 = Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0x85e296);
    if (!bVar1) break;
    Lib::List<Kernel::Unit_*>::Iterator::next((Iterator *)in_stack_fffffffffffffff0._lst);
    Unit::inputType((Unit *)0x85e2b6);
    local_11 = getInputType(AXIOM,AXIOM);
  }
  return local_11;
}

Assistant:

UnitInputType Kernel::getInputType(UnitList* units)
{
  ASS(units);

  UnitList::Iterator uit(units);
  ALWAYS(uit.hasNext());
  UnitInputType res = uit.next()->inputType();

  while(uit.hasNext()) {
    res = Kernel::getInputType(res, uit.next()->inputType());
  }
  return res;
}